

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O2

bool __thiscall
UnscentedKalmanFilter::GenerateAugmentedSigmaPoints
          (UnscentedKalmanFilter *this,VectorXd *x,MatrixXd *P,MatrixXd *Xsig_aug)

{
  int *x_00;
  double dVar1;
  DenseIndex DVar2;
  ComputationInfo CVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  ostream *poVar6;
  range_error *this_00;
  DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *m;
  int iVar7;
  long lVar8;
  long index;
  VectorXd x_aug;
  MatrixXd P_aug;
  MatrixXd L;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> lltOfPaug;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_1a0;
  PointerType local_178;
  long lStack_170;
  Nested local_160;
  Index IStack_158;
  double local_150;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> es;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> local_58 [40];
  
  DVar2 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  x_00 = &this->n_aug_;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&x_aug,(long)this->n_aug_);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&P_aug,x_00,x_00);
  iVar7 = (int)DVar2;
  lVar8 = (long)iVar7;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head
            ((SegmentReturnType *)&es,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x_aug,
             lVar8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::
  lazyAssign<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)&es,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x);
  for (index = (long)iVar7; index < *x_00; index = index + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x_aug,index);
    *pSVar4 = 0.0;
  }
  es.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setConstant
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&P_aug,(Scalar *)&es);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::topLeftCorner
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&es,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&P_aug,lVar8,lVar8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
  lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)&es,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)P);
  dVar1 = this->std_a_;
  lVar8 = (long)this->n_aug_ + -2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&P_aug,lVar8,
                      lVar8);
  *pSVar5 = dVar1 * dVar1;
  dVar1 = this->std_yawdd_;
  lVar8 = (long)this->n_aug_ + -1;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&P_aug,lVar8,
                      lVar8);
  *pSVar5 = dVar1 * dVar1;
  Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::LLT(&lltOfPaug,&P_aug);
  CVar3 = Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::info(&lltOfPaug);
  if (CVar3 != NumericalIssue) {
    es.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixL(&lltOfPaug);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&L,
               (EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                *)&es);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&es,Xsig_aug,0);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::
    lazyAssign<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)&es,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x_aug);
    dVar1 = (double)this->n_aug_ + this->lambda_;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    lVar8 = 0;
    while (iVar7 = *x_00, lVar8 < iVar7) {
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                (&local_1a0,&L,lVar8);
      local_178 = local_1a0.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                  .m_data;
      lStack_170 = local_1a0.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                   .m_rows.m_value;
      local_160 = local_1a0.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .m_xpr;
      IStack_158 = local_1a0.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                   .m_outerStride;
      local_150 = dVar1;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                  *)&es,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&x_aug,
                 (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                  *)&local_178);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_58,Xsig_aug,
                 lVar8 + 1);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::
      lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>>
                (local_58,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                           *)&es);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                (&local_1a0,&L,lVar8);
      local_178 = local_1a0.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                  .m_data;
      lStack_170 = local_1a0.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                   .m_rows.m_value;
      local_160 = local_1a0.
                  super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                  .
                  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                  .m_xpr;
      IStack_158 = local_1a0.
                   super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                   .m_outerStride;
      local_150 = dVar1;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                  *)&es,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&x_aug,
                 (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                  *)&local_178);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_58,Xsig_aug,
                 (long)(iVar7 + (int)lVar8 + 1));
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::
      lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>const>>
                (local_58,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                           *)&es);
      lVar8 = lVar8 + 1;
    }
    if (2 < this->debug_) {
      poVar6 = std::operator<<((ostream *)&std::cout,"L:\n");
      poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&L);
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<((ostream *)&std::cout,"Xsig_aug:\n");
      poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                        Xsig_aug);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    free(L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    free(lltOfPaug.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_data);
    free(P_aug.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    free(x_aug.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    return true;
  }
  if (this->debug_ != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"LLT failed!");
    std::endl<char,std::char_traits<char>>(poVar6);
    Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::EigenSolver(&es,&P_aug,true);
    poVar6 = std::operator<<((ostream *)&std::cout,"P_aug:");
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&P_aug
                              );
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"Eigenvalues of P_aug:");
    poVar6 = std::endl<char,std::char_traits<char>>(poVar6);
    m = (DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)
        Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvalues(&es);
    poVar6 = Eigen::operator<<(poVar6,m);
    std::endl<char,std::char_traits<char>>(poVar6);
    Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~EigenSolver(&es);
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"LLT failed");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

bool UnscentedKalmanFilter::GenerateAugmentedSigmaPoints(const VectorXd &x, const MatrixXd &P, MatrixXd &Xsig_aug) const {

    bool ret = true;
    int n_x = x.rows();
    
    // create augmented mean vector
    VectorXd x_aug(n_aug_);
  
    // create augmented state covariance
    MatrixXd P_aug(n_aug_, n_aug_);

    // create augmented mean state
    x_aug.head(n_x) = x;
    for (int i=n_x; i<n_aug_; i++)
	    x_aug(i) = 0.0;

    // create augmented covariance matrix
    P_aug.fill(0.0);
    P_aug.topLeftCorner(n_x,n_x) = P;
    P_aug(n_aug_-2,n_aug_-2) = std_a_*std_a_;
    P_aug(n_aug_-1,n_aug_-1) = std_yawdd_*std_yawdd_;
 
    // Take matrix square root
    // 1. compute the Cholesky decomposition of P_aug
    Eigen::LLT<MatrixXd> lltOfPaug(P_aug); 
    if (lltOfPaug.info() == Eigen::NumericalIssue) {
	// if decomposition fails, we have numerical issues
        if (debug_) {
	    std::cout << "LLT failed!" << std::endl;
	    Eigen::EigenSolver<MatrixXd> es(P_aug);
	    cout << "P_aug:" << P_aug << endl;
	    cout << "Eigenvalues of P_aug:" << endl << es.eigenvalues() << endl;
	}
	throw std::range_error("LLT failed");
    }
    // 2. get the lower triangle
    MatrixXd L = lltOfPaug.matrixL(); 

    Xsig_aug.col(0) = x_aug;
        
    double s = sqrt(lambda_+n_aug_);

    for (int i=0; i<n_aug_; i++) {
	int j = i+1;
	int k = j+n_aug_;
        Xsig_aug.col(j) = x_aug + s * L.col(i);
        Xsig_aug.col(k) = x_aug - s * L.col(i);
    }

    if (debug_ > 2) {
        std::cout << "L:\n" << L << std::endl;
        std::cout << "Xsig_aug:\n" << Xsig_aug << std::endl;
    }
    return ret;
}